

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O3

string * tinyformat::format<long_long>(string *__return_storage_ptr__,char *fmt,longlong *args)

{
  ostringstream oss;
  FormatArg local_1b0;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_1b0.m_formatImpl = detail::FormatArg::formatImpl<long_long>;
  local_1b0.m_toIntImpl = detail::FormatArg::toIntImpl<long_long>;
  local_1b0.m_value = args;
  detail::formatImpl((ostream *)local_198,fmt,&local_1b0,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}